

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range.h
# Opt level: O2

iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *
llvm::make_range<llvm::AppleAcceleratorTable::ValueIterator>
          (iterator_range<llvm::AppleAcceleratorTable::ValueIterator> *__return_storage_ptr__,
          ValueIterator *x,ValueIterator *y)

{
  ValueIterator local_1a8;
  ValueIterator local_e0;
  
  AppleAcceleratorTable::ValueIterator::ValueIterator(&local_1a8,x);
  AppleAcceleratorTable::ValueIterator::ValueIterator(&local_e0,y);
  iterator_range<llvm::AppleAcceleratorTable::ValueIterator>::iterator_range
            (__return_storage_ptr__,&local_1a8,&local_e0);
  DWARFAcceleratorTable::Entry::~Entry(&local_e0.Current.super_Entry);
  DWARFAcceleratorTable::Entry::~Entry(&local_1a8.Current.super_Entry);
  return __return_storage_ptr__;
}

Assistant:

iterator_range<T> make_range(T x, T y) {
  return iterator_range<T>(std::move(x), std::move(y));
}